

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_parse_fd_(ly_ctx *ctx,int fd,LYS_INFORMAT format,char *revision,int implement)

{
  int iVar1;
  char *local_48;
  char *addr;
  size_t length;
  lys_module *module;
  char *pcStack_28;
  int implement_local;
  char *revision_local;
  LYS_INFORMAT format_local;
  int fd_local;
  ly_ctx *ctx_local;
  
  module._4_4_ = implement;
  pcStack_28 = revision;
  revision_local._0_4_ = format;
  revision_local._4_4_ = fd;
  _format_local = ctx;
  if ((ctx == (ly_ctx *)0x0) || (fd < 0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_parse_fd_");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    iVar1 = lyp_mmap(ctx,fd,(long)(int)(uint)(format == LYS_IN_YANG),(size_t *)&addr,&local_48);
    if (iVar1 == 0) {
      if (local_48 == (char *)0x0) {
        ly_log(_format_local,LY_LLERR,LY_EINVAL,"Empty schema file.");
        ctx_local = (ly_ctx *)0x0;
      }
      else {
        length = (size_t)lys_parse_mem_(_format_local,local_48,(LYS_INFORMAT)revision_local,
                                        pcStack_28,1,module._4_4_);
        lyp_munmap(local_48,(size_t)addr);
        if ((length != 0) && (*(long *)(length + 0x38) == 0)) {
          lys_parse_set_filename(_format_local,(char **)(length + 0x38),revision_local._4_4_);
        }
        ctx_local = (ly_ctx *)length;
      }
    }
    else {
      ly_log(_format_local,LY_LLERR,LY_ESYS,"Mapping file descriptor into memory failed (%s()).",
             "lys_parse_fd_");
      ctx_local = (ly_ctx *)0x0;
    }
  }
  return (lys_module *)ctx_local;
}

Assistant:

const struct lys_module *
lys_parse_fd_(struct ly_ctx *ctx, int fd, LYS_INFORMAT format, const char *revision, int implement)
{
    const struct lys_module *module;
    size_t length;
    char *addr;

    if (!ctx || fd < 0) {
        LOGARG;
        return NULL;
    }

    if (lyp_mmap(ctx, fd, format == LYS_IN_YANG ? 1 : 0, &length, (void **)&addr)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!addr) {
        LOGERR(ctx, LY_EINVAL, "Empty schema file.");
        return NULL;
    }

    module = lys_parse_mem_(ctx, addr, format, revision, 1, implement);
    lyp_munmap(addr, length);

    if (module && !module->filepath) {
        lys_parse_set_filename(ctx, (const char **)&module->filepath, fd);
    }

    return module;
}